

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textreader.hpp
# Opt level: O3

void __thiscall TextReader::parse_error(TextReader *this,string *message)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  size_t pos;
  size_t line_index;
  pointer pcVar3;
  undefined4 *puVar4;
  TextReaderException exception;
  string local_b8;
  string local_98;
  TextReaderException local_78;
  
  pos = this->current_token_pos_;
  line_index = this->current_line_index_;
  pcVar3 = (this->current_line_)._M_dataplus._M_p;
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_98,pcVar3,pcVar3 + (this->current_line_)._M_string_length);
  pcVar3 = (message->_M_dataplus)._M_p;
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b8,pcVar3,pcVar3 + message->_M_string_length);
  TextReaderException::TextReaderException(&local_78,line_index,pos,&local_98,&local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  puVar4 = (undefined4 *)__cxa_allocate_exception(0x50);
  paVar1 = &local_78.line_.field_2;
  *puVar4 = (undefined4)local_78.line_index_;
  puVar4[1] = local_78.line_index_._4_4_;
  puVar4[2] = (undefined4)local_78.pos_;
  puVar4[3] = local_78.pos_._4_4_;
  *(undefined4 **)(puVar4 + 4) = puVar4 + 8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.line_._M_dataplus._M_p == paVar1) {
    puVar4[8] = local_78.line_.field_2._M_allocated_capacity._0_4_;
    puVar4[9] = local_78.line_.field_2._M_allocated_capacity._4_4_;
    puVar4[10] = local_78.line_.field_2._8_4_;
    puVar4[0xb] = local_78.line_.field_2._12_4_;
  }
  else {
    *(pointer *)(puVar4 + 4) = local_78.line_._M_dataplus._M_p;
    *(ulong *)(puVar4 + 8) =
         CONCAT44(local_78.line_.field_2._M_allocated_capacity._4_4_,
                  local_78.line_.field_2._M_allocated_capacity._0_4_);
  }
  paVar2 = &local_78.message_.field_2;
  *(size_type *)(puVar4 + 6) = local_78.line_._M_string_length;
  local_78.line_._M_string_length = 0;
  local_78.line_.field_2._M_allocated_capacity._0_4_ =
       local_78.line_.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
  *(undefined4 **)(puVar4 + 0xc) = puVar4 + 0x10;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.message_._M_dataplus._M_p == paVar2) {
    puVar4[0x10] = local_78.message_.field_2._M_allocated_capacity._0_4_;
    puVar4[0x11] = local_78.message_.field_2._M_allocated_capacity._4_4_;
    puVar4[0x12] = local_78.message_.field_2._8_4_;
    puVar4[0x13] = local_78.message_.field_2._12_4_;
  }
  else {
    *(pointer *)(puVar4 + 0xc) = local_78.message_._M_dataplus._M_p;
    *(ulong *)(puVar4 + 0x10) =
         CONCAT44(local_78.message_.field_2._M_allocated_capacity._4_4_,
                  local_78.message_.field_2._M_allocated_capacity._0_4_);
  }
  *(size_type *)(puVar4 + 0xe) = local_78.message_._M_string_length;
  local_78.message_._M_string_length = 0;
  local_78.message_.field_2._M_allocated_capacity._0_4_ =
       local_78.message_.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
  local_78.line_._M_dataplus._M_p = (pointer)paVar1;
  local_78.message_._M_dataplus._M_p = (pointer)paVar2;
  __cxa_throw(puVar4,&TextReaderException::typeinfo,TextReaderException::~TextReaderException);
}

Assistant:

void parse_error(std::string message) {
        TextReaderException exception(current_line_index_, current_token_pos_, current_line_, message);
        throw exception;
    }